

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O0

void __thiscall
p2t::SweepContext::AddHole
          (SweepContext *this,vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline)

{
  size_type sVar1;
  const_reference __x;
  uint local_1c;
  uint i;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline_local;
  SweepContext *this_local;
  
  InitEdges(this,polyline);
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::size(polyline);
    if (sVar1 <= local_1c) break;
    __x = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::operator[]
                    (polyline,(ulong)local_1c);
    std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::push_back(&this->points_,__x);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void SweepContext::AddHole(const std::vector<Point*>& polyline)
{
  InitEdges(polyline);
  for(unsigned int i = 0; i < polyline.size(); i++) {
    points_.push_back(polyline[i]);
  }
}